

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

void Aig_ManFlipFirstPo(Aig_Man_t *p)

{
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  pObj = Aig_ManCo(p,0);
  Aig_ObjChild0Flip(pObj);
  return;
}

Assistant:

void Aig_ManFlipFirstPo( Aig_Man_t * p )
{
    Aig_ObjChild0Flip( Aig_ManCo(p, 0) ); 
}